

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O1

float nite::distancePointToLine(Vec2 *Point,Vec2 *P1,Vec2 *P2)

{
  float fVar1;
  float fVar2;
  double dVar3;
  float fVar4;
  double dVar5;
  float fVar6;
  float fVar7;
  
  fVar6 = P2->x - P1->x;
  fVar2 = P2->y - P1->y;
  fVar4 = ((Point->x - P1->x) * fVar6 + (Point->y - P1->y) * fVar2) /
          (fVar2 * fVar2 + fVar6 * fVar6);
  if (0.0 <= fVar4) {
    fVar1 = P1->x;
    fVar7 = P2->x;
    if ((((fVar1 != fVar7) || (NAN(fVar1) || NAN(fVar7))) || (P1->y != P2->y)) ||
       (NAN(P1->y) || NAN(P2->y))) {
      if (fVar4 <= 1.0) {
        fVar7 = fVar6 * fVar4 + fVar1;
        fVar2 = fVar2 * fVar4 + P1->y;
      }
      else {
        fVar2 = P2->y;
      }
      goto LAB_00189855;
    }
  }
  fVar7 = P1->x;
  fVar2 = P1->y;
LAB_00189855:
  dVar5 = (double)(Point->x - fVar7);
  dVar3 = (double)(Point->y - fVar2);
  dVar3 = dVar3 * dVar3 + dVar5 * dVar5;
  if (dVar3 < 0.0) {
    dVar3 = ::sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  return (float)dVar3;
}

Assistant:

float nite::distancePointToLine(const nite::Vec2 &Point, const nite::Vec2 &P1, const nite::Vec2 &P2){
	float A = Point.x - P1.x;
	float B = Point.y - P1.y;
	float C = P2.x - P1.x;
	float D = P2.y - P1.y;
	float Dot = A*C+B*D;
	float lenSq = nite::pow(C, 2) + nite::pow(D, 2);
	float Param = Dot/lenSq;
	float xx, yy;
	if (Param < 0 || (P1.x == P2.x && P1.y == P2.y)){
		xx = P1.x;
		yy = P1.y;
	}else
	if (Param > 1){
		xx = P2.x;
		yy = P2.y;
	}else{
		xx = P1.x + Param * C;
		yy = P1.y + Param * D;
	}
	float dx = Point.x - xx;
	float dy = Point.y - yy;
	return nite::sqrt(nite::pow(dx, 2) + nite::pow(dy, 2));
}